

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-haproxy.c
# Opt level: O2

void cf_haproxy_close(Curl_cfilter *cf,Curl_easy *data)

{
  curl_trc_feat *pcVar1;
  undefined4 *puVar2;
  Curl_cfilter *pCVar3;
  
  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
    pcVar1 = (data->state).feat;
    if (pcVar1 == (curl_trc_feat *)0x0) {
      if (cf == (Curl_cfilter *)0x0) goto LAB_001141af;
    }
    else if ((cf == (Curl_cfilter *)0x0) || (pcVar1->log_level < 1)) goto LAB_001141af;
    if (0 < cf->cft->log_level) {
      Curl_trc_cf_infof(data,cf,"close");
    }
  }
LAB_001141af:
  cf->field_0x24 = cf->field_0x24 & 0xfe;
  puVar2 = (undefined4 *)cf->ctx;
  *puVar2 = 0;
  Curl_dyn_reset((dynbuf *)(puVar2 + 2));
  pCVar3 = cf->next;
  if (pCVar3 == (Curl_cfilter *)0x0) {
    return;
  }
  (*(code *)pCVar3->cft->do_close)(pCVar3,data);
  return;
}

Assistant:

static void cf_haproxy_close(struct Curl_cfilter *cf,
                             struct Curl_easy *data)
{
  CURL_TRC_CF(data, cf, "close");
  cf->connected = FALSE;
  cf_haproxy_ctx_reset(cf->ctx);
  if(cf->next)
    cf->next->cft->do_close(cf->next, data);
}